

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void pcache1TruncateUnsafe(PCache1 *pCache,uint iLimit)

{
  uint *puVar1;
  PCache1 *pPVar2;
  ulong uVar3;
  PgHdr1 **ppPVar4;
  PgHdr1 *pPage;
  
  if (pCache->nHash != 0) {
    uVar3 = 0;
    do {
      pPage = pCache->apHash[uVar3];
      if (pPage != (PgHdr1 *)0x0) {
        ppPVar4 = pCache->apHash + uVar3;
        do {
          if (pPage->iKey < iLimit) {
            ppPVar4 = &pPage->pNext;
          }
          else {
            pCache->nPage = pCache->nPage - 1;
            *ppPVar4 = pPage->pNext;
            if (pPage->isPinned == '\0') {
              pcache1PinPage(pPage);
            }
            pPVar2 = pPage->pCache;
            pcache1Free((pPage->page).pBuf);
            if (pPVar2->bPurgeable != 0) {
              puVar1 = &pPVar2->pGroup->nCurrentPage;
              *puVar1 = *puVar1 - 1;
            }
          }
          pPage = *ppPVar4;
        } while (pPage != (PgHdr1 *)0x0);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < pCache->nHash);
  }
  return;
}

Assistant:

static void pcache1TruncateUnsafe(
  PCache1 *pCache,             /* The cache to truncate */
  unsigned int iLimit          /* Drop pages with this pgno or larger */
){
  TESTONLY( unsigned int nPage = 0; )  /* To assert pCache->nPage is correct */
  unsigned int h;
  assert( sqlite3_mutex_held(pCache->pGroup->mutex) );
  for(h=0; h<pCache->nHash; h++){
    PgHdr1 **pp = &pCache->apHash[h]; 
    PgHdr1 *pPage;
    while( (pPage = *pp)!=0 ){
      if( pPage->iKey>=iLimit ){
        pCache->nPage--;
        *pp = pPage->pNext;
        if( !pPage->isPinned ) pcache1PinPage(pPage);
        pcache1FreePage(pPage);
      }else{
        pp = &pPage->pNext;
        TESTONLY( nPage++; )
      }
    }
  }
  assert( pCache->nPage==nPage );
}